

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

string_type * __thiscall
toml::detail::serializer<toml::type_config>::format_key
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,key_type *key)

{
  byte __c;
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  char cVar4;
  int iVar5;
  size_type sVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  region reg;
  location loc;
  string local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  serializer<toml::type_config> *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined1 local_e0 [24];
  size_type sStack_c8;
  location local_78;
  
  local_108 = this;
  if (key->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"\"","");
  }
  else {
    pcVar1 = (key->_M_dataplus)._M_p;
    local_100 = &local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,pcVar1,pcVar1 + key->_M_string_length);
    local_130._M_string_length = (size_type)local_f8;
    if (local_100 == &local_f0) {
      sStack_c8 = local_f0._8_8_;
      local_e0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_e0 + 0x10);
    }
    else {
      local_e0._0_8_ = local_100;
    }
    local_e0._17_7_ = local_f0._M_allocated_capacity._1_7_;
    local_e0[0x10] = local_f0._M_local_buf[0];
    local_e0._8_8_ = local_f8;
    local_f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_f0._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_e0 + 0x10)) {
      local_130.field_2._8_8_ = sStack_c8;
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130._M_dataplus._M_p = (pointer)local_e0._0_8_;
    }
    local_130.field_2._M_allocated_capacity = local_e0._16_8_;
    local_100 = &local_f0;
    make_temporary_location(&local_78,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,
                      CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]) + 1);
    }
    syntax::unquoted_key((repeat_at_least *)&local_130,&local_108->spec_);
    repeat_at_least::scan((region *)local_e0,(repeat_at_least *)&local_130,&local_78);
    if ((long *)local_130.field_2._M_allocated_capacity != (long *)0x0) {
      (**(code **)(*(long *)local_130.field_2._M_allocated_capacity + 8))();
    }
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_e0._0_8_ ==
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0) ||
       (local_78.location_ <
        (ulong)((long)((local_78.source_.
                        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)((local_78.source_.
                       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start))) {
      local_110 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_110;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"","");
      sVar2 = key->_M_string_length;
      if (sVar2 != 0) {
        pcVar1 = (key->_M_dataplus)._M_p;
        sVar6 = 0;
        do {
          paVar7 = &local_130.field_2;
          __c = pcVar1[sVar6];
          switch(__c) {
          case 8:
            local_130._M_dataplus._M_p = (pointer)paVar7;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\b","");
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,local_130._M_dataplus._M_p,local_130._M_string_length);
            break;
          case 9:
            local_130._M_dataplus._M_p = (pointer)paVar7;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\t","");
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,local_130._M_dataplus._M_p,local_130._M_string_length);
            break;
          case 10:
            local_130._M_dataplus._M_p = (pointer)paVar7;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\n","");
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,local_130._M_dataplus._M_p,local_130._M_string_length);
            break;
          case 0xb:
switchD_003da528_caseD_b:
            iVar5 = (int)(char)__c;
            if ((__c < 9) || (__c == 0x7f || (byte)(__c - 10) < 0x16)) {
              if ((local_108->spec_).v1_1_0_add_escape_sequence_x == true) {
                local_130._M_dataplus._M_p = (pointer)paVar7;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\x","");
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __return_storage_ptr__,local_130._M_dataplus._M_p,
                            local_130._M_string_length);
              }
              else {
                local_130._M_dataplus._M_p = (pointer)paVar7;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\u00","");
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __return_storage_ptr__,local_130._M_dataplus._M_p,
                            local_130._M_string_length);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != paVar7) {
                operator_delete(local_130._M_dataplus._M_p,
                                local_130.field_2._M_allocated_capacity + 1);
              }
              iVar3 = iVar5 + 0xf;
              if (-1 < (char)__c) {
                iVar3 = iVar5;
              }
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __return_storage_ptr__,(char)(iVar3 >> 4) + '0');
              cVar4 = '7';
              if (iVar5 % 0x10 < 10) {
                cVar4 = '0';
              }
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __return_storage_ptr__,cVar4 + (char)(iVar5 % 0x10));
            }
            else {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __return_storage_ptr__,__c);
            }
            goto LAB_003da712;
          case 0xc:
            local_130._M_dataplus._M_p = (pointer)paVar7;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\f","");
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,local_130._M_dataplus._M_p,local_130._M_string_length);
            break;
          case 0xd:
            local_130._M_dataplus._M_p = (pointer)paVar7;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\r","");
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,local_130._M_dataplus._M_p,local_130._M_string_length);
            break;
          default:
            if (__c == 0x22) {
              local_130._M_dataplus._M_p = (pointer)paVar7;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\\"","");
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __return_storage_ptr__,local_130._M_dataplus._M_p,local_130._M_string_length
                       );
            }
            else {
              if (__c != 0x5c) goto switchD_003da528_caseD_b;
              local_130._M_dataplus._M_p = (pointer)paVar7;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\\\","");
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __return_storage_ptr__,local_130._M_dataplus._M_p,local_130._M_string_length
                       );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != paVar7) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
LAB_003da712:
          sVar6 = sVar6 + 1;
        } while (sVar2 != sVar6);
      }
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\"","");
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,local_130._M_dataplus._M_p,local_130._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = (key->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + key->_M_string_length);
    }
    region::~region((region *)local_e0);
    location::~location(&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

string_type format_key(const key_type& key) // {{{
    {
        if(key.empty())
        {
            return string_conv<string_type>("\"\"");
        }

        // check the key can be a bare (unquoted) key
        auto loc = detail::make_temporary_location(string_conv<std::string>(key));
        auto reg = detail::syntax::unquoted_key(this->spec_).scan(loc);
        if(reg.is_ok() && loc.eof())
        {
            return key;
        }

        //if it includes special characters, then format it in a "quoted" key.
        string_type formatted = string_conv<string_type>("\"");
        for(const char_type c : key)
        {
            switch(c)
            {
                case char_type('\\'): {formatted += string_conv<string_type>("\\\\"); break;}
                case char_type('\"'): {formatted += string_conv<string_type>("\\\""); break;}
                case char_type('\b'): {formatted += string_conv<string_type>("\\b" ); break;}
                case char_type('\t'): {formatted += string_conv<string_type>("\\t" ); break;}
                case char_type('\f'): {formatted += string_conv<string_type>("\\f" ); break;}
                case char_type('\n'): {formatted += string_conv<string_type>("\\n" ); break;}
                case char_type('\r'): {formatted += string_conv<string_type>("\\r" ); break;}
                default  :
                {
                    // ASCII ctrl char
                    if( (char_type(0x00) <= c && c <= char_type(0x08)) ||
                        (char_type(0x0A) <= c && c <= char_type(0x1F)) ||
                        c == char_type(0x7F))
                    {
                        if(spec_.v1_1_0_add_escape_sequence_x)
                        {
                            formatted += string_conv<string_type>("\\x");
                        }
                        else
                        {
                            formatted += string_conv<string_type>("\\u00");
                        }
                        const auto c1 = c / 16;
                        const auto c2 = c % 16;
                        formatted += static_cast<char_type>('0' + c1);
                        if(c2 < 10)
                        {
                            formatted += static_cast<char_type>('0' + c2);
                        }
                        else // 10 <= c2
                        {
                            formatted += static_cast<char_type>('A' + (c2 - 10));
                        }
                    }
                    else
                    {
                        formatted += c;
                    }
                    break;
                }
            }
        }
        formatted += string_conv<string_type>("\"");
        return formatted;
    }